

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c02d::CpuTest_sax_indexed_indirect_Test::TestBody
          (CpuTest_sax_indexed_indirect_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  int iVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar4;
  pointer *__ptr;
  char cVar5;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_a8;
  code *local_98;
  int *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  MatcherBase<unsigned_char> local_78;
  undefined1 local_60 [8];
  MatcherBase<unsigned_char> local_58;
  MatcherBase<unsigned_short> local_40;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.a = 0xaa;
  (this->super_CpuTest).expected.x = '\x0f';
  (this->super_CpuTest).registers.a = 0xaa;
  (this->super_CpuTest).registers.x = '\x0f';
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0x83);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x4322);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x329,"mmu","read_byte(0x4322)");
  local_88 = (int *)operator_new(4);
  *local_88 = 0xab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *local_88;
  *(int *)&pAVar4[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0xab);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x32a,"mmu","read_byte(0xAB)");
  local_88 = (int *)operator_new(4);
  *local_88 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *local_88;
  *(int *)&pAVar4[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,
             (ushort)(byte)((this->super_CpuTest).registers.x + 0xab));
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x32b,"mmu","read_byte(u16_to_u8(0xAB + registers.x))");
  local_88 = (int *)operator_new(4);
  *local_88 = 0x34;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *local_88;
  *(int *)&pAVar4[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,
             (ushort)(byte)((this->super_CpuTest).registers.x + 0xac));
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x32d,"mmu","read_byte(u16_to_u8(0xAB + registers.x + 1u))");
  local_88 = (int *)operator_new(4);
  *local_88 = 0x12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *local_88;
  *(int *)&pAVar4[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_a8,0x1234);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_78,'\n');
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_a8,(Matcher<unsigned_char> *)&local_78);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0x32f,"mmu","write_byte(0x1234, 0b00001010)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_78);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_a8);
  cVar5 = '\x06';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar5 = cVar5 + -1;
  } while (cVar5 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x333,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_a8._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, sax_indexed_indirect) {
    registers.pc = expected.pc = 0x4321;
    registers.a = expected.a = 0b10101010;
    registers.x = expected.x = 0b00001111;

    stage_instruction(SAX_INXIND);

    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0xAB));
    EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x00)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + registers.x)))
            .WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + registers.x + 1u)))
            .WillOnce(Return(0x12));
    EXPECT_CALL(mmu, write_byte(0x1234, 0b00001010));

    step_execution(6);

    EXPECT_EQ(expected, registers);
}